

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O0

_Bool ethash_compute_full_data
                (void *mem,uint64_t full_size,ethash_light_t light,ethash_callback_t callback)

{
  int iVar1;
  ulong uVar2;
  code *in_RCX;
  ethash_light_t in_RDX;
  ulong in_RSI;
  node *in_RDI;
  double dVar3;
  uint32_t n;
  double progress;
  double progress_change;
  node *full_nodes;
  uint32_t max_n;
  uint local_4c;
  double local_48;
  _Bool local_1;
  
  if (((in_RSI & 0x7f) == 0) && ((in_RSI & 0x3f) == 0)) {
    uVar2 = in_RSI >> 6;
    local_48 = 0.0;
    for (local_4c = 0; local_4c != (uint)uVar2; local_4c = local_4c + 1) {
      if ((in_RCX != (code *)0x0) && ((int)((ulong)local_4c % ((uVar2 & 0xffffffff) / 100)) == 0)) {
        dVar3 = ceil(local_48 * 100.0);
        iVar1 = (*in_RCX)((long)dVar3 & 0xffffffff);
        if (iVar1 != 0) {
          return false;
        }
      }
      local_48 = (double)(1.0 / (float)(uVar2 & 0xffffffff)) + local_48;
      ethash_calculate_dag_item(in_RDI,(uint32_t)(in_RSI >> 0x20),in_RDX);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ethash_compute_full_data(
	void* mem,
	uint64_t full_size,
	ethash_light_t const light,
	ethash_callback_t callback
)
{
	if (full_size % (sizeof(uint32_t) * MIX_WORDS) != 0 ||
		(full_size % sizeof(node)) != 0) {
		return false;
	}
	uint32_t const max_n = (uint32_t)(full_size / sizeof(node));
	node* full_nodes = mem;
	double const progress_change = 1.0f / max_n;
	double progress = 0.0f;
	// now compute full nodes
	for (uint32_t n = 0; n != max_n; ++n) {
		if (callback &&
			n % (max_n / 100) == 0 &&
			callback((unsigned int)(ceil(progress * 100.0f))) != 0) {

			return false;
		}
		progress += progress_change;
		ethash_calculate_dag_item(&(full_nodes[n]), n, light);
	}
	return true;
}